

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  pointer *ppbVar1;
  pointer pbVar2;
  InternalRunDeathTestFlag *pIVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  int *piVar8;
  void *__addr;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  __sighandler_t p_Var9;
  long *plVar10;
  _func_void *p_Var11;
  ulong *puVar12;
  ulong *puVar13;
  size_type *psVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  ulong *extraout_RDX_00;
  ulong *extraout_RDX_01;
  ulong *extraout_RDX_02;
  ulong *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar16;
  pointer ppcVar17;
  pointer pbVar18;
  ulong uVar19;
  undefined8 uVar20;
  const_iterator __position;
  size_t __len;
  _union_1457 local_2f0;
  sigaction ignore_sigprof_action;
  string filter_flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  size_type *local_1a0;
  string internal_flag;
  ExecDeathTestArgs args_2;
  int local_160;
  int local_15c;
  undefined1 auStack_158 [4];
  int death_test_index;
  Arguments args;
  int local_138;
  int local_134;
  int pipe_fd [2];
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  ulong *local_50;
  long local_48;
  ulong local_40;
  long lStack_38;
  
  UnitTest::GetInstance();
  pIVar3 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_15c = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar3 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar3->write_fd_;
    return EXECUTE_TEST;
  }
  iVar4 = pipe(&local_138);
  if (iVar4 == -1) {
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (ulong *)*puVar7;
    puVar13 = puVar7 + 2;
    if (local_50 == puVar13) {
      local_40 = *puVar13;
      lStack_38 = puVar7[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *puVar13;
    }
    local_48 = puVar7[1];
    *puVar7 = puVar13;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (ulong *)*plVar6;
    puVar13 = (ulong *)(plVar6 + 2);
    if (local_90 == puVar13) {
      local_80 = *puVar13;
      lStack_78 = plVar6[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *puVar13;
    }
    local_88 = plVar6[1];
    *plVar6 = (long)puVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_f0._M_dataplus._M_p._0_4_ = 0x58c;
    StreamableToString<int>(&local_d0,(int *)&local_f0);
    uVar19 = 0xf;
    if (local_90 != &local_80) {
      uVar19 = local_80;
    }
    if (uVar19 < local_d0._M_string_length + local_88) {
      uVar20 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar20 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar20 < local_d0._M_string_length + local_88) goto LAB_00159993;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_00159993:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)*puVar7;
    puVar13 = puVar7 + 2;
    if ((ulong *)local_b0._M_dataplus._M_p == puVar13) {
      local_b0.field_2._M_allocated_capacity = *puVar13;
      local_b0.field_2._8_8_ = puVar7[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar13;
    }
    local_b0._M_string_length = puVar7[1];
    *puVar7 = puVar13;
    puVar7[1] = 0;
    *(undefined1 *)puVar13 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_2f0.sa_handler = (__sighandler_t)*plVar6;
    p_Var9 = (__sighandler_t)(plVar6 + 2);
    if (local_2f0.sa_handler == p_Var9) {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var9;
      ignore_sigprof_action.sa_mask.__val[1] = plVar6[3];
      local_2f0 = (_union_1457)&ignore_sigprof_action.sa_mask;
    }
    else {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var9;
    }
    ignore_sigprof_action.__sigaction_handler =
         *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar6 + 1);
    *plVar6 = (long)p_Var9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    filter_flag.field_2._8_8_ = *puVar7;
    puVar13 = puVar7 + 2;
    if ((ulong *)filter_flag.field_2._8_8_ == puVar13) {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar13;
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar7[3];
      filter_flag.field_2._8_8_ =
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar13;
    }
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar7[1];
    *puVar7 = puVar13;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    DeathTestAbort((string *)((long)&filter_flag.field_2 + 8));
    puVar7 = extraout_RAX_02;
    filter_flag.field_2._8_8_ = extraout_RDX_02;
LAB_0015a37a:
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar13;
  }
  else {
    iVar4 = fcntl(local_134,2,0);
    if (iVar4 != -1) {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--","");
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      puVar13 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar13) {
        local_80 = *puVar13;
        lStack_78 = plVar6[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar13;
        local_90 = (ulong *)*plVar6;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)puVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      psVar14 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_b0.field_2._M_allocated_capacity = *psVar14;
        local_b0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar14;
        local_b0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_b0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_2f0.sa_handler = (__sighandler_t)&ignore_sigprof_action.sa_mask;
      p_Var9 = (__sighandler_t)(plVar6 + 2);
      if ((__sighandler_t)*plVar6 == p_Var9) {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var9;
        ignore_sigprof_action.sa_mask.__val[1] = plVar6[3];
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var9;
        local_2f0.sa_handler = (__sighandler_t)*plVar6;
      }
      ignore_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar6 + 1);
      *plVar6 = (long)p_Var9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      ppbVar1 = &args_1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar10;
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar6[3];
        filter_flag.field_2._8_8_ = ppbVar1;
      }
      else {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar10;
        filter_flag.field_2._8_8_ = (long *)*plVar6;
      }
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append(filter_flag.field_2._M_local_buf + 8);
      ignore_sigprof_action.sa_restorer = (_func_void *)&filter_flag._M_string_length;
      p_Var11 = (_func_void *)(plVar6 + 2);
      if ((_func_void *)*plVar6 == p_Var11) {
        filter_flag._M_string_length = *(size_type *)p_Var11;
        filter_flag.field_2._M_allocated_capacity = plVar6[3];
      }
      else {
        filter_flag._M_string_length = *(size_type *)p_Var11;
        ignore_sigprof_action.sa_restorer = (_func_void *)*plVar6;
      }
      filter_flag._M_dataplus._M_p = (pointer)plVar6[1];
      *plVar6 = (long)p_Var11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((pointer *)filter_flag.field_2._8_8_ != ppbVar1) {
        operator_delete((void *)filter_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      if ((__sigset_t *)local_2f0.sa_handler != &ignore_sigprof_action.sa_mask) {
        operator_delete(local_2f0.sa_handler,ignore_sigprof_action.sa_mask.__val[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"--","");
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
      puVar13 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_f0.field_2._M_allocated_capacity = *puVar13;
        local_f0.field_2._8_8_ = plVar6[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *puVar13;
        local_f0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_f0._M_string_length = plVar6[1];
      *plVar6 = (long)puVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
      puVar13 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_d0.field_2._M_allocated_capacity = *puVar13;
        local_d0.field_2._8_8_ = plVar6[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar13;
        local_d0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_d0._M_string_length = plVar6[1];
      *plVar6 = (long)puVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_70 = &local_60;
      puVar13 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar13) {
        local_60 = *puVar13;
        lStack_58 = plVar6[3];
      }
      else {
        local_60 = *puVar13;
        local_70 = (ulong *)*plVar6;
      }
      local_68 = plVar6[1];
      *plVar6 = (long)puVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
      puVar13 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar13) {
        local_40 = *puVar13;
        lStack_38 = plVar6[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *puVar13;
        local_50 = (ulong *)*plVar6;
      }
      local_48 = plVar6[1];
      *plVar6 = (long)puVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      StreamableToString<int>((string *)pipe_fd,&this->line_);
      uVar19 = 0xf;
      if (local_50 != &local_40) {
        uVar19 = local_40;
      }
      if (uVar19 < local_128 + local_48) {
        uVar20 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(pipe_fd[1],pipe_fd[0]) != &local_120) {
          uVar20 = local_120._M_allocated_capacity;
        }
        if ((ulong)uVar20 < local_128 + local_48) goto LAB_001585bb;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)pipe_fd,0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_001585bb:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_50,CONCAT44(pipe_fd[1],pipe_fd[0]));
      }
      local_90 = &local_80;
      puVar13 = puVar7 + 2;
      if ((ulong *)*puVar7 == puVar13) {
        local_80 = *puVar13;
        lStack_78 = puVar7[3];
      }
      else {
        local_80 = *puVar13;
        local_90 = (ulong *)*puVar7;
      }
      local_88 = puVar7[1];
      *puVar7 = puVar13;
      puVar7[1] = 0;
      *(undefined1 *)puVar13 = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      puVar13 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_b0.field_2._M_allocated_capacity = *puVar13;
        local_b0.field_2._8_8_ = puVar7[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *puVar13;
        local_b0._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_b0._M_string_length = puVar7[1];
      *puVar7 = puVar13;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      StreamableToString<int>((string *)auStack_158,&local_15c);
      uVar20 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        uVar20 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar20 <
          (pointer)((long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_start + local_b0._M_string_length)) {
        ppcVar17 = (pointer)0xf;
        if ((pointer *)_auStack_158 !=
            &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          ppcVar17 = args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
        if (ppcVar17 <
            (pointer)((long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start + local_b0._M_string_length))
        goto LAB_001586ef;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)auStack_158,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
      }
      else {
LAB_001586ef:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_b0,(ulong)_auStack_158);
      }
      local_2f0.sa_handler = (__sighandler_t)&ignore_sigprof_action.sa_mask;
      p_Var9 = (__sighandler_t)(puVar7 + 2);
      if ((__sighandler_t)*puVar7 == p_Var9) {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var9;
        ignore_sigprof_action.sa_mask.__val[1] = puVar7[3];
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var9;
        local_2f0.sa_handler = (__sighandler_t)*puVar7;
      }
      ignore_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(puVar7 + 1);
      *puVar7 = p_Var9;
      puVar7[1] = 0;
      *p_Var9 = (__sighandler_t)0x0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar10;
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar6[3];
        filter_flag.field_2._8_8_ = ppbVar1;
      }
      else {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar10;
        filter_flag.field_2._8_8_ = (long *)*plVar6;
      }
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      StreamableToString<int>((string *)((long)&internal_flag.field_2 + 8),&local_134);
      pbVar2 = (pointer)((long)&((args_1.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        CONCAT44(args_2.argv._4_4_,(int)args_2.argv));
      pbVar18 = (pointer)0xf;
      if ((pointer *)filter_flag.field_2._8_8_ != ppbVar1) {
        pbVar18 = args_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (pbVar18 < pbVar2) {
        pbVar18 = (pointer)0xf;
        if ((int *)internal_flag.field_2._8_8_ != &args_2.close_fd) {
          pbVar18 = (pointer)args_2._8_8_;
        }
        if (pbVar18 < pbVar2) goto LAB_00158823;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)((long)&internal_flag.field_2 + 8),0,(char *)0x0,
                            filter_flag.field_2._8_8_);
      }
      else {
LAB_00158823:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           (filter_flag.field_2._M_local_buf + 8,internal_flag.field_2._8_8_);
      }
      local_1a0 = &internal_flag._M_string_length;
      psVar14 = puVar7 + 2;
      if ((size_type *)*puVar7 == psVar14) {
        internal_flag._M_string_length = *psVar14;
        internal_flag.field_2._M_allocated_capacity = puVar7[3];
      }
      else {
        internal_flag._M_string_length = *psVar14;
        local_1a0 = (size_type *)*puVar7;
      }
      internal_flag._M_dataplus._M_p = (pointer)puVar7[1];
      *puVar7 = psVar14;
      puVar7[1] = 0;
      *(undefined1 *)psVar14 = 0;
      if ((int *)internal_flag.field_2._8_8_ != &args_2.close_fd) {
        operator_delete((void *)internal_flag.field_2._8_8_,args_2._8_8_ + 1);
      }
      if ((pointer *)filter_flag.field_2._8_8_ != ppbVar1) {
        operator_delete((void *)filter_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      if ((__sigset_t *)local_2f0.sa_handler != &ignore_sigprof_action.sa_mask) {
        operator_delete(local_2f0.sa_handler,ignore_sigprof_action.sa_mask.__val[0] + 1);
      }
      if ((pointer *)_auStack_158 !=
          &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete(_auStack_158,
                        (long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                              .super__Vector_impl_data._M_finish + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(pipe_fd[1],pipe_fd[0]) != &local_120) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(pipe_fd[1],pipe_fd[0]),local_120._M_allocated_capacity + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      Arguments::Arguments((Arguments *)auStack_158);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&g_argvs_abi_cxx11_;
      if (g_injected_test_argvs_abi_cxx11_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        __x = g_injected_test_argvs_abi_cxx11_;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&filter_flag.field_2 + 8),__x);
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)auStack_158,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&filter_flag.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&filter_flag.field_2 + 8));
      __position._M_current =
           args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start + -1;
      filter_flag.field_2._8_8_ = strdup((char *)ignore_sigprof_action.sa_restorer);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)auStack_158,__position,
                 (value_type *)((long)&filter_flag.field_2 + 8));
      filter_flag.field_2._8_8_ = strdup((char *)local_1a0);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)auStack_158,
                 (const_iterator)
                 (args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_start + -1),
                 (value_type *)((long)&filter_flag.field_2 + 8));
      filter_flag.field_2._8_8_ = ppbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)((long)&filter_flag.field_2 + 8),"")
      ;
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if ((pointer *)filter_flag.field_2._8_8_ != ppbVar1) {
        operator_delete((void *)filter_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      internal_flag.field_2._8_8_ = _auStack_158;
      args_2.argv._0_4_ = local_138;
      memset(&local_2f0,0,0x98);
      sigemptyset((sigset_t *)&ignore_sigprof_action);
      local_2f0 = (_union_1457)0x1;
      do {
        iVar4 = sigaction(0x1b,(sigaction *)&local_2f0,(sigaction *)((long)&filter_flag.field_2 + 8)
                         );
        if (iVar4 != -1) {
          if (FLAGS_gtest_death_test_use_fork != '\0') {
            iVar4 = fork();
            if (iVar4 == 0) {
              ExecDeathTestChildMain((void *)((long)&internal_flag.field_2 + 8));
              goto LAB_00159278;
            }
LAB_00158c97:
            goto LAB_00158c9e;
          }
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
LAB_00159278:
            AssumeRole();
          }
          iVar4 = getpagesize();
          __len = (size_t)(iVar4 * 2);
          __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
          if (__addr == (void *)0xffffffffffffffff) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"CHECK failed: File ","");
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
            local_d0._M_dataplus._M_p = (pointer)*puVar7;
            puVar13 = puVar7 + 2;
            if ((ulong *)local_d0._M_dataplus._M_p == puVar13) {
              local_d0.field_2._M_allocated_capacity = *puVar13;
              local_d0.field_2._8_8_ = puVar7[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *puVar13;
            }
            local_d0._M_string_length = puVar7[1];
            *puVar7 = puVar13;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
            local_70 = &local_60;
            puVar13 = (ulong *)*puVar7;
            puVar12 = puVar7 + 2;
            if (puVar13 != puVar12) goto LAB_00159caa;
            local_60 = *puVar12;
            lStack_58 = puVar7[3];
            goto LAB_00159cb5;
          }
          lVar16 = 0;
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
            lVar16 = __len - 0x40;
          }
          if (((uint)(iVar4 * 2) < 0x41) || (((ulong)(lVar16 + (long)__addr) & 0x3f) != 0)) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"CHECK failed: File ","");
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
            local_d0._M_dataplus._M_p = (pointer)*puVar7;
            puVar13 = puVar7 + 2;
            if ((ulong *)local_d0._M_dataplus._M_p == puVar13) {
              local_d0.field_2._M_allocated_capacity = *puVar13;
              local_d0.field_2._8_8_ = puVar7[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *puVar13;
            }
            local_d0._M_string_length = puVar7[1];
            *puVar7 = puVar13;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
            local_70 = (ulong *)*puVar7;
            puVar13 = puVar7 + 2;
            if (local_70 == puVar13) {
              local_60 = *puVar13;
              lStack_58 = puVar7[3];
              local_70 = &local_60;
            }
            else {
              local_60 = *puVar13;
            }
            local_68 = puVar7[1];
            *puVar7 = puVar13;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            pipe_fd[0] = 0x563;
            StreamableToString<int>(&local_110,pipe_fd);
            uVar19 = 0xf;
            if (local_70 != &local_60) {
              uVar19 = local_60;
            }
            if (uVar19 < local_110._M_string_length + local_68) {
              uVar20 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                uVar20 = local_110.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar20 < local_110._M_string_length + local_68) goto LAB_00159dd2;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_110,0,(char *)0x0,(ulong)local_70);
            }
            else {
LAB_00159dd2:
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)local_110._M_dataplus._M_p);
            }
            local_50 = (ulong *)*puVar7;
            puVar13 = puVar7 + 2;
            if (local_50 == puVar13) {
              local_40 = *puVar13;
              lStack_38 = puVar7[3];
              local_50 = &local_40;
            }
            else {
              local_40 = *puVar13;
            }
            local_48 = puVar7[1];
            *puVar7 = puVar13;
            puVar7[1] = 0;
            *(undefined1 *)puVar13 = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
            local_90 = (ulong *)*puVar7;
            puVar13 = puVar7 + 2;
            if (local_90 == puVar13) {
              local_80 = *puVar13;
              lStack_78 = puVar7[3];
              local_90 = &local_80;
            }
            else {
              local_80 = *puVar13;
            }
            local_88 = puVar7[1];
            *puVar7 = puVar13;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
            psVar14 = puVar7 + 2;
            if (paVar15 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) goto LAB_0015a557;
            local_b0.field_2._M_allocated_capacity = *psVar14;
            local_b0.field_2._8_8_ = puVar7[3];
            goto LAB_0015a568;
          }
          iVar4 = clone(ExecDeathTestChildMain,(void *)(lVar16 + (long)__addr),0x11,
                        (void *)((long)&internal_flag.field_2 + 8));
          iVar5 = munmap(__addr,__len);
          if (iVar5 != -1) goto LAB_00158c97;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,"CHECK failed: File ","");
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
          local_d0._M_dataplus._M_p = (pointer)*puVar7;
          puVar13 = puVar7 + 2;
          if ((ulong *)local_d0._M_dataplus._M_p == puVar13) {
            local_d0.field_2._M_allocated_capacity = *puVar13;
            local_d0.field_2._8_8_ = puVar7[3];
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *puVar13;
          }
          local_d0._M_string_length = puVar7[1];
          *puVar7 = puVar13;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
          local_70 = (ulong *)*puVar7;
          puVar13 = puVar7 + 2;
          if (local_70 == puVar13) {
            local_60 = *puVar13;
            lStack_58 = puVar7[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *puVar13;
          }
          local_68 = puVar7[1];
          *puVar7 = puVar13;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          pipe_fd[0] = 0x567;
          StreamableToString<int>(&local_110,pipe_fd);
          uVar19 = 0xf;
          if (local_70 != &local_60) {
            uVar19 = local_60;
          }
          if (uVar19 < local_110._M_string_length + local_68) {
            uVar20 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              uVar20 = local_110.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar20 < local_110._M_string_length + local_68) goto LAB_00159e6d;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_70);
          }
          else {
LAB_00159e6d:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)local_110._M_dataplus._M_p);
          }
          local_50 = (ulong *)*puVar7;
          puVar13 = puVar7 + 2;
          if (local_50 == puVar13) {
            local_40 = *puVar13;
            lStack_38 = puVar7[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *puVar13;
          }
          local_48 = puVar7[1];
          *puVar7 = puVar13;
          puVar7[1] = 0;
          *(undefined1 *)puVar13 = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
          local_90 = (ulong *)*puVar7;
          puVar13 = puVar7 + 2;
          if (local_90 == puVar13) {
            local_80 = *puVar13;
            lStack_78 = puVar7[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *puVar13;
          }
          local_88 = puVar7[1];
          *puVar7 = puVar13;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
          psVar14 = puVar7 + 2;
          if (paVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) goto LAB_0015a58b;
          local_b0.field_2._M_allocated_capacity = *psVar14;
          local_b0.field_2._8_8_ = puVar7[3];
          goto LAB_0015a59c;
        }
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CHECK failed: File ","")
      ;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_f0._M_dataplus._M_p = (pointer)*plVar6;
      puVar13 = (ulong *)(plVar6 + 2);
      if ((ulong *)local_f0._M_dataplus._M_p == puVar13) {
        local_f0.field_2._M_allocated_capacity = *puVar13;
        local_f0.field_2._8_8_ = plVar6[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *puVar13;
      }
      local_f0._M_string_length = plVar6[1];
      *plVar6 = (long)puVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_d0._M_dataplus._M_p = (pointer)*plVar6;
      puVar13 = (ulong *)(plVar6 + 2);
      if ((ulong *)local_d0._M_dataplus._M_p == puVar13) {
        local_d0.field_2._M_allocated_capacity = *puVar13;
        local_d0.field_2._8_8_ = plVar6[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar13;
      }
      local_d0._M_string_length = plVar6[1];
      *plVar6 = (long)puVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_160 = 0x549;
      StreamableToString<int>((string *)pipe_fd,&local_160);
      uVar20 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar20 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar20 < local_128 + local_d0._M_string_length) {
        uVar20 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(pipe_fd[1],pipe_fd[0]) != &local_120) {
          uVar20 = local_120._M_allocated_capacity;
        }
        if ((ulong)uVar20 < local_128 + local_d0._M_string_length) goto LAB_00158ff7;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)pipe_fd,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
      }
      else {
LAB_00158ff7:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_d0,CONCAT44(pipe_fd[1],pipe_fd[0]));
      }
      local_70 = (ulong *)*puVar7;
      puVar13 = puVar7 + 2;
      if (local_70 == puVar13) {
        local_60 = *puVar13;
        lStack_58 = puVar7[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar13;
      }
      local_68 = puVar7[1];
      *puVar7 = puVar13;
      puVar7[1] = 0;
      *(undefined1 *)puVar13 = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      local_50 = (ulong *)*puVar7;
      puVar13 = puVar7 + 2;
      if (local_50 == puVar13) {
        local_40 = *puVar13;
        lStack_38 = puVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *puVar13;
      }
      local_48 = puVar7[1];
      *puVar7 = puVar13;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (ulong *)*puVar7;
      puVar13 = puVar7 + 2;
      if (local_90 == puVar13) {
        local_80 = *puVar13;
        lStack_78 = puVar7[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar13;
      }
      local_88 = puVar7[1];
      *puVar7 = puVar13;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)*puVar7;
      puVar12 = puVar7 + 2;
      if ((ulong *)local_b0._M_dataplus._M_p == puVar12) {
        local_b0.field_2._M_allocated_capacity = *puVar12;
        local_b0.field_2._8_8_ = puVar7[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *puVar12;
      }
      local_b0._M_string_length = puVar7[1];
      *puVar7 = puVar12;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      DeathTestAbort(&local_b0);
      puVar7 = extraout_RAX;
      paVar15 = extraout_RDX;
      goto LAB_00159c42;
    }
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (ulong *)*puVar7;
    puVar13 = puVar7 + 2;
    if (local_50 == puVar13) {
      local_40 = *puVar13;
      lStack_38 = puVar7[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *puVar13;
    }
    local_48 = puVar7[1];
    *puVar7 = puVar13;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (ulong *)*puVar7;
    puVar13 = puVar7 + 2;
    if (local_90 == puVar13) {
      local_80 = *puVar13;
      lStack_78 = puVar7[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *puVar13;
    }
    local_88 = puVar7[1];
    *puVar7 = puVar13;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    local_f0._M_dataplus._M_p._0_4_ = 0x58f;
    StreamableToString<int>(&local_d0,(int *)&local_f0);
    uVar19 = 0xf;
    if (local_90 != &local_80) {
      uVar19 = local_80;
    }
    if (uVar19 < local_d0._M_string_length + local_88) {
      uVar20 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar20 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar20 < local_d0._M_string_length + local_88) goto LAB_00159a33;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_00159a33:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)*puVar7;
    puVar13 = puVar7 + 2;
    if ((ulong *)local_b0._M_dataplus._M_p == puVar13) {
      local_b0.field_2._M_allocated_capacity = *puVar13;
      local_b0.field_2._8_8_ = puVar7[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar13;
    }
    local_b0._M_string_length = puVar7[1];
    *puVar7 = puVar13;
    puVar7[1] = 0;
    *(undefined1 *)puVar13 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_2f0.sa_handler = (__sighandler_t)*plVar6;
    p_Var9 = (__sighandler_t)(plVar6 + 2);
    if (local_2f0.sa_handler == p_Var9) {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var9;
      ignore_sigprof_action.sa_mask.__val[1] = plVar6[3];
      local_2f0 = (_union_1457)&ignore_sigprof_action.sa_mask;
    }
    else {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var9;
    }
    ignore_sigprof_action.__sigaction_handler =
         *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar6 + 1);
    *plVar6 = (long)p_Var9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    filter_flag.field_2._8_8_ = *puVar7;
    puVar13 = puVar7 + 2;
    if ((ulong *)filter_flag.field_2._8_8_ != puVar13) goto LAB_0015a37a;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar13;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar7[3];
    filter_flag.field_2._8_8_ =
         &args_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  }
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort((string *)((long)&filter_flag.field_2 + 8));
  puVar7 = extraout_RAX_03;
  local_90 = extraout_RDX_03;
  goto LAB_0015a3ae;
LAB_00158d30:
  do {
    iVar5 = close(local_134);
    if (iVar5 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar4;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_138;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)auStack_158);
      if (local_1a0 != &internal_flag._M_string_length) {
        operator_delete(local_1a0,internal_flag._M_string_length + 1);
      }
      if (ignore_sigprof_action.sa_restorer != (_func_void *)&filter_flag._M_string_length) {
        operator_delete(ignore_sigprof_action.sa_restorer,filter_flag._M_string_length + 1);
      }
      return OVERSEE_TEST;
    }
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
  local_70 = (ulong *)*puVar7;
  puVar13 = puVar7 + 2;
  if (local_70 == puVar13) {
    local_60 = *puVar13;
    lStack_58 = puVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar13;
  }
  local_68 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (ulong *)*plVar6;
  puVar13 = (ulong *)(plVar6 + 2);
  if (local_50 == puVar13) {
    local_40 = *puVar13;
    lStack_38 = plVar6[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *puVar13;
  }
  local_48 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_110._M_dataplus._M_p._0_4_ = 0x5a6;
  StreamableToString<int>(&local_f0,(int *)&local_110);
  uVar19 = 0xf;
  if (local_50 != &local_40) {
    uVar19 = local_40;
  }
  if (uVar19 < local_f0._M_string_length + local_48) {
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar20 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_f0._M_string_length + local_48) goto LAB_00159148;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_00159148:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_f0._M_dataplus._M_p);
  }
  local_90 = (ulong *)*puVar7;
  puVar13 = puVar7 + 2;
  if (local_90 == puVar13) {
    local_80 = *puVar13;
    lStack_78 = puVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar13;
  }
  local_88 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)*puVar7;
  puVar13 = puVar7 + 2;
  if ((ulong *)local_b0._M_dataplus._M_p == puVar13) {
    local_b0.field_2._M_allocated_capacity = *puVar13;
    local_b0.field_2._8_8_ = puVar7[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *puVar13;
  }
  local_b0._M_string_length = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_2f0.sa_handler = (__sighandler_t)*plVar6;
  p_Var9 = (__sighandler_t)(plVar6 + 2);
  if (local_2f0.sa_handler == p_Var9) {
    ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var9;
    ignore_sigprof_action.sa_mask.__val[1] = plVar6[3];
    local_2f0 = (_union_1457)&ignore_sigprof_action.sa_mask;
  }
  else {
    ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var9;
  }
  ignore_sigprof_action.__sigaction_handler =
       *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar6 + 1);
  *plVar6 = (long)p_Var9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  filter_flag.field_2._8_8_ = *puVar7;
  puVar12 = puVar7 + 2;
  if ((ulong *)filter_flag.field_2._8_8_ != puVar12) goto LAB_00159c76;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar12;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar7[3];
  filter_flag.field_2._8_8_ = ppbVar1;
  goto LAB_00159c87;
  while (piVar8 = __errno_location(), *piVar8 == 4) {
LAB_00158c9e:
    iVar5 = sigaction(0x1b,(sigaction *)((long)&filter_flag.field_2 + 8),(sigaction *)0x0);
    if (iVar5 != -1) {
      if (iVar4 != -1) goto LAB_00158d30;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
      local_d0._M_dataplus._M_p = (pointer)*puVar7;
      puVar13 = puVar7 + 2;
      if ((ulong *)local_d0._M_dataplus._M_p == puVar13) {
        local_d0.field_2._M_allocated_capacity = *puVar13;
        local_d0.field_2._8_8_ = puVar7[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar13;
      }
      local_d0._M_string_length = puVar7[1];
      *puVar7 = puVar13;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      local_70 = (ulong *)*puVar7;
      puVar13 = puVar7 + 2;
      if (local_70 == puVar13) {
        local_60 = *puVar13;
        lStack_58 = puVar7[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar13;
      }
      local_68 = puVar7[1];
      *puVar7 = puVar13;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      pipe_fd[0] = 0x577;
      StreamableToString<int>(&local_110,pipe_fd);
      uVar19 = 0xf;
      if (local_70 != &local_60) {
        uVar19 = local_60;
      }
      if (uVar19 < local_110._M_string_length + local_68) {
        uVar20 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          uVar20 = local_110.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar20 < local_110._M_string_length + local_68) goto LAB_00159c00;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_70);
      }
      else {
LAB_00159c00:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_70,(ulong)local_110._M_dataplus._M_p);
      }
      local_50 = (ulong *)*puVar7;
      puVar13 = puVar7 + 2;
      if (local_50 == puVar13) {
        local_40 = *puVar13;
        lStack_38 = puVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *puVar13;
      }
      local_48 = puVar7[1];
      *puVar7 = puVar13;
      puVar7[1] = 0;
      *(undefined1 *)puVar13 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (ulong *)*plVar6;
      puVar13 = (ulong *)(plVar6 + 2);
      if (local_90 == puVar13) {
        local_80 = *puVar13;
        lStack_78 = plVar6[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar13;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)puVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
      psVar14 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar14) {
        local_b0.field_2._M_allocated_capacity = *psVar14;
        local_b0.field_2._8_8_ = plVar6[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar14;
      }
      local_b0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      DeathTestAbort(&local_b0);
      puVar7 = extraout_RAX_04;
      local_b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_0015a523;
    }
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
  local_f0._M_dataplus._M_p = (pointer)*puVar7;
  puVar13 = puVar7 + 2;
  if ((ulong *)local_f0._M_dataplus._M_p == puVar13) {
    local_f0.field_2._M_allocated_capacity = *puVar13;
    local_f0.field_2._8_8_ = puVar7[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *puVar13;
  }
  local_f0._M_string_length = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
  local_d0._M_dataplus._M_p = (pointer)*puVar7;
  puVar13 = puVar7 + 2;
  if ((ulong *)local_d0._M_dataplus._M_p == puVar13) {
    local_d0.field_2._M_allocated_capacity = *puVar13;
    local_d0.field_2._8_8_ = puVar7[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *puVar13;
  }
  local_d0._M_string_length = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_160 = 0x574;
  StreamableToString<int>((string *)pipe_fd,&local_160);
  uVar20 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    uVar20 = local_d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar20 < local_128 + local_d0._M_string_length) {
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(pipe_fd[1],pipe_fd[0]) != &local_120) {
      uVar20 = local_120._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_128 + local_d0._M_string_length) goto LAB_001590aa;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)pipe_fd,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
  }
  else {
LAB_001590aa:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d0,CONCAT44(pipe_fd[1],pipe_fd[0]));
  }
  local_70 = (ulong *)*puVar7;
  puVar13 = puVar7 + 2;
  if (local_70 == puVar13) {
    local_60 = *puVar13;
    lStack_58 = puVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar13;
  }
  local_68 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (ulong *)*puVar7;
  puVar13 = puVar7 + 2;
  if (local_50 == puVar13) {
    local_40 = *puVar13;
    lStack_38 = puVar7[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *puVar13;
  }
  local_48 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (ulong *)*puVar7;
  puVar13 = puVar7 + 2;
  if (local_90 == puVar13) {
    local_80 = *puVar13;
    lStack_78 = puVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar13;
  }
  local_88 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7;
  puVar12 = puVar7 + 2;
  if (paVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_b0.field_2._M_allocated_capacity = *puVar12;
    local_b0.field_2._8_8_ = puVar7[3];
  }
  else {
LAB_00159c42:
    local_b0.field_2._M_allocated_capacity = *puVar12;
    local_b0._M_dataplus._M_p = (pointer)paVar15;
  }
  local_b0._M_string_length = puVar7[1];
  *puVar7 = puVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar7 = extraout_RAX_00;
  filter_flag.field_2._8_8_ = extraout_RDX_00;
LAB_00159c76:
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar12;
LAB_00159c87:
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar7[1];
  *puVar7 = puVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort((string *)((long)&filter_flag.field_2 + 8));
  puVar7 = extraout_RAX_01;
  puVar13 = extraout_RDX_01;
LAB_00159caa:
  local_60 = *puVar12;
  local_70 = puVar13;
LAB_00159cb5:
  local_68 = puVar7[1];
  *puVar7 = puVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  pipe_fd[0] = 0x555;
  StreamableToString<int>(&local_110,pipe_fd);
  uVar19 = 0xf;
  if (local_70 != &local_60) {
    uVar19 = local_60;
  }
  if (uVar19 < local_110._M_string_length + local_68) {
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar20 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_110._M_string_length + local_68) goto LAB_00159d37;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_00159d37:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_110._M_dataplus._M_p);
  }
  local_50 = (ulong *)*puVar7;
  puVar13 = puVar7 + 2;
  if (local_50 == puVar13) {
    local_40 = *puVar13;
    lStack_38 = puVar7[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *puVar13;
  }
  local_48 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (ulong *)*puVar7;
  puVar13 = puVar7 + 2;
  if (local_90 == puVar13) {
    local_80 = *puVar13;
    lStack_78 = puVar7[3];
    local_90 = &local_80;
  }
  else {
LAB_0015a3ae:
    local_80 = *puVar13;
  }
  local_88 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)*puVar7;
  psVar14 = puVar7 + 2;
  if ((size_type *)local_b0._M_dataplus._M_p == psVar14) {
    local_b0.field_2._M_allocated_capacity = *psVar14;
    local_b0.field_2._8_8_ = puVar7[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
LAB_0015a523:
    local_b0.field_2._M_allocated_capacity = *psVar14;
  }
  local_b0._M_string_length = puVar7[1];
  *puVar7 = psVar14;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar7 = extraout_RAX_05;
  paVar15 = extraout_RDX_05;
LAB_0015a557:
  local_b0.field_2._M_allocated_capacity = *psVar14;
  local_b0._M_dataplus._M_p = (pointer)paVar15;
LAB_0015a568:
  local_b0._M_string_length = puVar7[1];
  *puVar7 = psVar14;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar7 = extraout_RAX_06;
  paVar15 = extraout_RDX_06;
LAB_0015a58b:
  local_b0.field_2._M_allocated_capacity = *psVar14;
  local_b0._M_dataplus._M_p = (pointer)paVar15;
LAB_0015a59c:
  local_b0._M_string_length = puVar7[1];
  *puVar7 = psVar14;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  Arguments::~Arguments((Arguments *)auStack_158);
  if (local_1a0 != &internal_flag._M_string_length) {
    operator_delete(local_1a0,internal_flag._M_string_length + 1);
  }
  if (ignore_sigprof_action.sa_restorer != (_func_void *)&filter_flag._M_string_length) {
    operator_delete(ignore_sigprof_action.sa_restorer,filter_flag._M_string_length + 1);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}